

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void createAxesMesh(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec<3,_float,_(glm::qualifier)0> vVar5;
  vec<3,_float,_(glm::qualifier)0> vVar6;
  vec3 BLUE1;
  vec3 GREEN1;
  vec3 RED1;
  u32 vbo;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  vec3 BG_COLOR3;
  
  (*glad_debug_glGenVertexArrays)(1,&gpu::axesVao);
  (*glad_debug_glBindVertexArray)(gpu::axesVao);
  (*glad_debug_glGenBuffers)(1,&vbo);
  (*glad_debug_glBindBuffer)(0x8892,vbo);
  BG_COLOR3.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3dcccccd;
  BG_COLOR3.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3e4ccccd;
  BG_COLOR3.field_2.z = 0.1;
  RED1.field_2.z = 0.0;
  RED1.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  RED1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  vVar4 = glm::mix<3,float,float,(glm::qualifier)0>(&BG_COLOR3,&RED1,0.4);
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = vVar4._0_8_;
  local_58._12_4_ = extraout_XMM0_Dd;
  GREEN1.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  GREEN1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  GREEN1.field_2.z = 0.0;
  vVar5 = glm::mix<3,float,float,(glm::qualifier)0>(&BG_COLOR3,&GREEN1,0.4);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = vVar5._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  BLUE1.field_2.z = 1.0;
  BLUE1.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  BLUE1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  vVar6 = glm::mix<3,float,float,(glm::qualifier)0>(&BG_COLOR3,&BLUE1,0.4);
  if (createAxesMesh()::verts == '\0') {
    local_68._8_4_ = extraout_XMM0_Dc_01;
    local_68._0_8_ = vVar6._0_8_;
    local_68._12_4_ = extraout_XMM0_Dd_01;
    iVar3 = __cxa_guard_acquire(&createAxesMesh()::verts);
    auVar2 = local_48;
    auVar1 = local_58;
    if (iVar3 != 0) {
      createAxesMesh::verts[0].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
      createAxesMesh::verts[0].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[0].pos.field_2.z = 0.0;
      createAxesMesh::verts[0].color.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_58._0_4_;
      createAxesMesh::verts[0].color.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_58._4_4_;
      createAxesMesh::verts[1].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[1].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[1].pos.field_2.z = 0.0;
      createAxesMesh::verts[1].color.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_58._0_4_;
      createAxesMesh::verts[1].color.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_58._4_4_;
      createAxesMesh::verts[2].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[2].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[2].pos.field_2.z = 0.0;
      createAxesMesh::verts[2].color.field_0 = RED1.field_0;
      createAxesMesh::verts[2].color.field_1 = RED1.field_1;
      createAxesMesh::verts[2].color.field_2 = RED1.field_2;
      createAxesMesh::verts[3].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
      createAxesMesh::verts[3].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[3].pos.field_2.z = 0.0;
      createAxesMesh::verts[3].color.field_0 = RED1.field_0;
      createAxesMesh::verts[3].color.field_1 = RED1.field_1;
      createAxesMesh::verts[3].color.field_2 = RED1.field_2;
      createAxesMesh::verts[4].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[4].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
      createAxesMesh::verts[4].pos.field_2.z = 0.0;
      createAxesMesh::verts[4].color.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_48._0_4_;
      createAxesMesh::verts[4].color.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_48._4_4_;
      createAxesMesh::verts[5].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[5].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[5].pos.field_2.z = 0.0;
      createAxesMesh::verts[5].color.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_48._0_4_;
      createAxesMesh::verts[5].color.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_48._4_4_;
      createAxesMesh::verts[6].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[6].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[6].pos.field_2.z = 0.0;
      createAxesMesh::verts[6].color.field_0 = GREEN1.field_0;
      createAxesMesh::verts[6].color.field_1 = GREEN1.field_1;
      createAxesMesh::verts[6].color.field_2 = GREEN1.field_2;
      createAxesMesh::verts[7].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[7].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
      createAxesMesh::verts[7].pos.field_2.z = 0.0;
      createAxesMesh::verts[7].color.field_0 = GREEN1.field_0;
      createAxesMesh::verts[7].color.field_1 = GREEN1.field_1;
      createAxesMesh::verts[7].color.field_2 = GREEN1.field_2;
      createAxesMesh::verts[8].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[8].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[8].pos.field_2.z = -1.0;
      createAxesMesh::verts[8].color.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_68._0_4_;
      createAxesMesh::verts[8].color.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_68._4_4_;
      createAxesMesh::verts[9].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[9].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[9].pos.field_2.z = 0.0;
      createAxesMesh::verts[9].color.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_68._0_4_;
      createAxesMesh::verts[9].color.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_68._4_4_;
      createAxesMesh::verts[10].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[10].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[10].pos.field_2.z = 0.0;
      createAxesMesh::verts[10].color.field_0 = BLUE1.field_0;
      createAxesMesh::verts[10].color.field_1 = BLUE1.field_1;
      createAxesMesh::verts[10].color.field_2 = BLUE1.field_2;
      createAxesMesh::verts[0xb].pos.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      createAxesMesh::verts[0xb].pos.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      createAxesMesh::verts[0xb].pos.field_2.z = 1.0;
      createAxesMesh::verts[0xb].color.field_0 = BLUE1.field_0;
      createAxesMesh::verts[0xb].color.field_1 = BLUE1.field_1;
      createAxesMesh::verts[0xb].color.field_2 = BLUE1.field_2;
      createAxesMesh::verts[0].color.field_2 = vVar4.field_2;
      createAxesMesh::verts[1].color.field_2 = vVar4.field_2;
      createAxesMesh::verts[4].color.field_2 = vVar5.field_2;
      createAxesMesh::verts[5].color.field_2 = vVar5.field_2;
      createAxesMesh::verts[8].color.field_2 = vVar6.field_2;
      createAxesMesh::verts[9].color.field_2 = vVar6.field_2;
      local_58 = auVar1;
      local_48 = auVar2;
      __cxa_guard_release(&createAxesMesh()::verts);
    }
  }
  (*glad_debug_glBufferData)(0x8892,0x120,createAxesMesh::verts,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0x18,(void *)0x0);
  (*glad_debug_glEnableVertexAttribArray)(1);
  (*glad_debug_glVertexAttribPointer)(1,3,0x1406,'\0',0x18,(void *)0xc);
  return;
}

Assistant:

void createAxesMesh()
{
    glGenVertexArrays(1, &gpu::axesVao);
    glBindVertexArray(gpu::axesVao);
    u32 vbo;
    glGenBuffers(1, &vbo);
    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    const vec3 BG_COLOR3 = BG_COLOR;
    struct Vert { vec3 pos, color; };
    const float alpha = 0.4f;
    const vec3 RED1 = {1, 0, 0};
    const vec3 RED2 = glm::mix(BG_COLOR3, RED1, alpha);
    const vec3 GREEN1 = {0, 1, 0};
    const vec3 GREEN2 = glm::mix(BG_COLOR3, GREEN1, alpha);
    const vec3 BLUE1 = {0, 0, 1};
    const vec3 BLUE2 = glm::mix(BG_COLOR3, BLUE1, alpha);
    static const Vert verts[] = {
        // X
        {{-1, 0, 0}, RED2},
        {{ 0, 0, 0}, RED2},
        {{ 0, 0, 0}, RED1},
        {{+1, 0, 0}, RED1},
        // Y
        {{0, -1, 0}, GREEN2},
        {{0,  0, 0}, GREEN2},
        {{0,  0, 0}, GREEN1},
        {{0, +1, 0}, GREEN1},
        // Z
        {{0, 0, -1}, BLUE2},
        {{0, 0,  0}, BLUE2},
        {{0, 0,  0}, BLUE1},
        {{0, 0, +1}, BLUE1}
    };
    constexpr int stride = 6 * sizeof(float);
    glBufferData(GL_ARRAY_BUFFER, sizeof(verts), verts, GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, stride, nullptr);
    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, stride, (void*)(3*sizeof(float)));
}